

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterop.cpp
# Opt level: O0

void anon_unknown.dwarf_d07c3::testInteropVec4(void)

{
  ostream *poVar1;
  float *pfVar2;
  reference pvVar3;
  reference pvVar4;
  Vec4<float> v_5;
  float s_4 [4];
  Vec4<float> v_4;
  Vec4<float> v_3;
  array<float,_4UL> s_3;
  Vec4<float> v_2;
  vector<float,_std::allocator<float>_> s_2;
  Vec4<float> v_1;
  xyzw<float> s_1;
  Vec4<float> v;
  SimpleVec<float,_4> s;
  undefined1 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe69;
  bool bVar5;
  undefined1 in_stack_fffffffffffffe6a;
  undefined1 uVar6;
  undefined1 in_stack_fffffffffffffe6b;
  undefined1 uVar7;
  undefined1 in_stack_fffffffffffffe6c;
  undefined1 uVar8;
  undefined1 in_stack_fffffffffffffe6d;
  undefined1 uVar9;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 uVar10;
  undefined1 in_stack_fffffffffffffe6f;
  undefined1 uVar11;
  Vec4<float> *in_stack_fffffffffffffe70;
  Vec4<float> *this;
  float in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  V4f *in_stack_fffffffffffffe80;
  V4f *v_00;
  allocator_type *in_stack_fffffffffffffe98;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffea0;
  Vec4<float> in_stack_fffffffffffffea8;
  float local_148 [7];
  Vec4<float> local_12c;
  Vec4<float> local_11c;
  Vec4<float> local_10c [2];
  Vec4<float> local_ec;
  undefined8 local_dc;
  undefined8 local_d4;
  Vec4<float> local_bc [2];
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 *local_88;
  undefined8 local_80;
  Vec4<float> local_78;
  V4f local_60;
  Vec4<float> local_50;
  xyzw<float> local_40 [2];
  Vec4<float> local_20;
  SimpleVec<float,_4> local_10;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"has_xyzw<SimpleVec<float,4>, float>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"has_xyzw<SimpleVec<int,4>, float>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"has_xyzw<SimpleVec<float,4>, float>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"has_xyzw<xyzw<float>, float>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"has_xyzw<xyzw<float>, float>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"has_xyzw<xy<float>, float>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"has_xyzw<xyzw<int>, float>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"has_xyzw<xyz_wrong<float>, float>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\n");
  std::operator<<((ostream *)&std::cout,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "has_subscript<SimpleVec<float,4>, float, 4>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "has_subscript<SimpleVec<int,4>, float, 4>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "has_subscript<SimpleVec<float,4>, float, 4>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"has_subscript<xyzw<float>, float, 4>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"has_subscript<xyzw<float>, float, 4>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"has_subscript<xy<float>, float, 4>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"has_subscript<xyzw<int>, float, 4>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "has_subscript<xyz_wrong<float>, float, 4>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "has_subscript<std::array<float, 3>, float, 4>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "has_subscript<std::array<int, 3>, float, 4>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "has_subscript<std::array<float, 4>, float, 4>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "has_subscript<std::vector<float>, float, 4>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,true);
  std::operator<<(poVar1,"\n");
  std::operator<<((ostream *)&std::cout,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"has_xyzw<ComboVec4<float>, float, 4>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "has_subscript<ComboVec4<float>, float, 4>::value = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  std::operator<<(poVar1,"\n");
  std::operator<<((ostream *)&std::cout,"\n");
  SimpleVec<float,_4>::SimpleVec(&local_10,0.0);
  pfVar2 = SimpleVec<float,_4>::operator[](&local_10,0);
  *pfVar2 = 1.0;
  pfVar2 = SimpleVec<float,_4>::operator[](&local_10,1);
  *pfVar2 = 2.0;
  pfVar2 = SimpleVec<float,_4>::operator[](&local_10,2);
  *pfVar2 = 3.0;
  pfVar2 = SimpleVec<float,_4>::operator[](&local_10,3);
  *pfVar2 = 4.0;
  Imath_3_2::Vec4<float>::Vec4<(anonymous_namespace)::SimpleVec<float,_4>,_0>
            (in_stack_fffffffffffffe80,
             (SimpleVec<float,_4> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_20,0);
  bVar5 = false;
  if ((*pfVar2 == 1.0) && (!NAN(*pfVar2))) {
    pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_20,1);
    bVar5 = false;
    if ((*pfVar2 == 2.0) && (!NAN(*pfVar2))) {
      pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_20,2);
      bVar5 = false;
      if ((*pfVar2 == 3.0) && (!NAN(*pfVar2))) {
        pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_20,3);
        bVar5 = *pfVar2 == 4.0;
      }
    }
  }
  if (!bVar5) {
    __assert_fail("v[0] == 1 && v[1] == 2 && v[2] == 3 && v[3] == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x1ee,"void (anonymous namespace)::testInteropVec4()");
  }
  pfVar2 = SimpleVec<float,_4>::operator[](&local_10,1);
  *pfVar2 = 42.0;
  Imath_3_2::Vec4<float>::operator=<(anonymous_namespace)::SimpleVec<float,_4>,_0>
            (in_stack_fffffffffffffe70,
             (SimpleVec<float,_4> *)
             CONCAT17(in_stack_fffffffffffffe6f,
                      CONCAT16(in_stack_fffffffffffffe6e,
                               CONCAT15(in_stack_fffffffffffffe6d,
                                        CONCAT14(in_stack_fffffffffffffe6c,
                                                 CONCAT13(in_stack_fffffffffffffe6b,
                                                          CONCAT12(in_stack_fffffffffffffe6a,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffe69,
                                                  in_stack_fffffffffffffe68))))))));
  pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_20,0);
  bVar5 = false;
  if ((*pfVar2 == 1.0) && (!NAN(*pfVar2))) {
    pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_20,1);
    bVar5 = false;
    if ((*pfVar2 == 42.0) && (!NAN(*pfVar2))) {
      pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_20,2);
      bVar5 = false;
      if ((*pfVar2 == 3.0) && (!NAN(*pfVar2))) {
        pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_20,3);
        bVar5 = *pfVar2 == 4.0;
      }
    }
  }
  if (!bVar5) {
    __assert_fail("v[0] == 1 && v[1] == 42 && v[2] == 3 && v[3] == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x1f1,"void (anonymous namespace)::testInteropVec4()");
  }
  Imath_3_2::Vec4<float>::Vec4<(anonymous_namespace)::SimpleVec<float,_4>,_0>
            (in_stack_fffffffffffffe80,
             (SimpleVec<float,_4> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  testVecVal4f(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,
               (float)((ulong)in_stack_fffffffffffffe70 >> 0x20),SUB84(in_stack_fffffffffffffe70,0))
  ;
  local_40[0].x = 1.0;
  local_40[0].y = 2.0;
  local_40[0].z = 3.0;
  local_40[0].w = 4.0;
  Imath_3_2::Vec4<float>::Vec4<(anonymous_namespace)::xyzw<float>,_0>
            (in_stack_fffffffffffffe70,
             (xyzw<float> *)
             CONCAT17(in_stack_fffffffffffffe6f,
                      CONCAT16(in_stack_fffffffffffffe6e,
                               CONCAT15(in_stack_fffffffffffffe6d,
                                        CONCAT14(in_stack_fffffffffffffe6c,
                                                 CONCAT13(in_stack_fffffffffffffe6b,
                                                          CONCAT12(in_stack_fffffffffffffe6a,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffe69,
                                                  in_stack_fffffffffffffe68))))))));
  pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_50,0);
  bVar5 = false;
  if ((*pfVar2 == 1.0) && (!NAN(*pfVar2))) {
    pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_50,1);
    bVar5 = false;
    if ((*pfVar2 == 2.0) && (!NAN(*pfVar2))) {
      pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_50,2);
      bVar5 = false;
      if ((*pfVar2 == 3.0) && (!NAN(*pfVar2))) {
        pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_50,3);
        bVar5 = *pfVar2 == 4.0;
      }
    }
  }
  if (!bVar5) {
    __assert_fail("v[0] == 1 && v[1] == 2 && v[2] == 3 && v[3] == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x1f9,"void (anonymous namespace)::testInteropVec4()");
  }
  local_40[0].y = 42.0;
  Imath_3_2::Vec4<float>::operator=<(anonymous_namespace)::xyzw<float>,_0>(&local_50,local_40);
  pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_50,0);
  bVar5 = false;
  if ((*pfVar2 == 1.0) && (!NAN(*pfVar2))) {
    pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_50,1);
    bVar5 = false;
    if ((*pfVar2 == 42.0) && (!NAN(*pfVar2))) {
      pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_50,2);
      bVar5 = false;
      if ((*pfVar2 == 3.0) && (!NAN(*pfVar2))) {
        pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_50,3);
        bVar5 = *pfVar2 == 4.0;
      }
    }
  }
  if (!bVar5) {
    __assert_fail("v[0] == 1 && v[1] == 42 && v[2] == 3 && v[3] == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x1fc,"void (anonymous namespace)::testInteropVec4()");
  }
  v_00 = &local_60;
  Imath_3_2::Vec4<float>::Vec4<(anonymous_namespace)::xyzw<float>,_0>
            (in_stack_fffffffffffffe70,
             (xyzw<float> *)
             CONCAT17(in_stack_fffffffffffffe6f,
                      CONCAT16(in_stack_fffffffffffffe6e,
                               CONCAT15(in_stack_fffffffffffffe6d,
                                        CONCAT14(in_stack_fffffffffffffe6c,
                                                 CONCAT13(in_stack_fffffffffffffe6b,
                                                          CONCAT12(in_stack_fffffffffffffe6a,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffe69,
                                                  in_stack_fffffffffffffe68))))))));
  testVecVal4f(v_00,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,
               (float)((ulong)in_stack_fffffffffffffe70 >> 0x20),SUB84(in_stack_fffffffffffffe70,0))
  ;
  local_98 = 0x3f800000;
  local_94 = 0x40000000;
  local_90 = 0x40400000;
  local_8c = 0x40800000;
  local_88 = &local_98;
  local_80 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x1b886e);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffea0,(initializer_list<float>)in_stack_fffffffffffffea8,
             in_stack_fffffffffffffe98);
  std::allocator<float>::~allocator((allocator<float> *)0x1b889f);
  Imath_3_2::Vec4<float>::Vec4<std::vector<float,_std::allocator<float>_>,_0>
            (v_00,(vector<float,_std::allocator<float>_> *)
                  CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  pfVar2 = Imath_3_2::Vec4<float>::operator[](local_bc,0);
  in_stack_fffffffffffffe7c = (float)((uint)in_stack_fffffffffffffe7c & 0xffffff);
  if ((*pfVar2 == 1.0) && (!NAN(*pfVar2))) {
    pfVar2 = Imath_3_2::Vec4<float>::operator[](local_bc,1);
    in_stack_fffffffffffffe7c = (float)((uint)in_stack_fffffffffffffe7c & 0xffffff);
    if ((*pfVar2 == 2.0) && (!NAN(*pfVar2))) {
      pfVar2 = Imath_3_2::Vec4<float>::operator[](local_bc,2);
      in_stack_fffffffffffffe7c = (float)((uint)in_stack_fffffffffffffe7c & 0xffffff);
      if ((*pfVar2 == 3.0) && (!NAN(*pfVar2))) {
        pfVar2 = Imath_3_2::Vec4<float>::operator[](local_bc,3);
        in_stack_fffffffffffffe7c =
             (float)CONCAT13(*pfVar2 == 4.0,SUB43(in_stack_fffffffffffffe7c,0));
      }
    }
  }
  if ((char)((uint)in_stack_fffffffffffffe7c >> 0x18) == '\0') {
    __assert_fail("v[0] == 1 && v[1] == 2 && v[2] == 3 && v[3] == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x203,"void (anonymous namespace)::testInteropVec4()");
  }
  this = &local_78;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)this,1);
  *pvVar3 = 42.0;
  Imath_3_2::Vec4<float>::operator=<std::vector<float,_std::allocator<float>_>,_0>
            (this,(vector<float,_std::allocator<float>_> *)
                  CONCAT17(in_stack_fffffffffffffe6f,
                           CONCAT16(in_stack_fffffffffffffe6e,
                                    CONCAT15(in_stack_fffffffffffffe6d,
                                             CONCAT14(in_stack_fffffffffffffe6c,
                                                      CONCAT13(in_stack_fffffffffffffe6b,
                                                               CONCAT12(in_stack_fffffffffffffe6a,
                                                                        CONCAT11(
                                                  in_stack_fffffffffffffe69,
                                                  in_stack_fffffffffffffe68))))))));
  pfVar2 = Imath_3_2::Vec4<float>::operator[](local_bc,0);
  uVar11 = false;
  if ((*pfVar2 == 1.0) && (!NAN(*pfVar2))) {
    pfVar2 = Imath_3_2::Vec4<float>::operator[](local_bc,1);
    uVar11 = false;
    if ((*pfVar2 == 42.0) && (!NAN(*pfVar2))) {
      pfVar2 = Imath_3_2::Vec4<float>::operator[](local_bc,2);
      uVar11 = false;
      if ((*pfVar2 == 3.0) && (!NAN(*pfVar2))) {
        pfVar2 = Imath_3_2::Vec4<float>::operator[](local_bc,3);
        uVar11 = *pfVar2 == 4.0;
      }
    }
  }
  if ((bool)uVar11 == false) {
    __assert_fail("v[0] == 1 && v[1] == 42 && v[2] == 3 && v[3] == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x206,"void (anonymous namespace)::testInteropVec4()");
  }
  Imath_3_2::Vec4<float>::Vec4<std::vector<float,_std::allocator<float>_>,_0>
            (v_00,(vector<float,_std::allocator<float>_> *)
                  CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  testVecVal4f(v_00,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,(float)((ulong)this >> 0x20)
               ,SUB84(this,0));
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)v_00)
  ;
  local_dc = 0x400000003f800000;
  local_d4 = 0x4080000040400000;
  Imath_3_2::Vec4<float>::Vec4<std::array<float,_4UL>,_0>
            (v_00,(array<float,_4UL> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
            );
  pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_ec,0);
  uVar10 = false;
  if ((*pfVar2 == 1.0) && (!NAN(*pfVar2))) {
    pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_ec,1);
    uVar10 = false;
    if ((*pfVar2 == 2.0) && (!NAN(*pfVar2))) {
      pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_ec,2);
      uVar10 = false;
      if ((*pfVar2 == 3.0) && (!NAN(*pfVar2))) {
        pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_ec,3);
        uVar10 = *pfVar2 == 4.0;
      }
    }
  }
  if ((bool)uVar10 == false) {
    __assert_fail("v[0] == 1 && v[1] == 2 && v[2] == 3 && v[3] == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x20d,"void (anonymous namespace)::testInteropVec4()");
  }
  pvVar4 = std::array<float,_4UL>::operator[]
                     ((array<float,_4UL> *)this,
                      CONCAT17(uVar11,CONCAT16(uVar10,CONCAT15(in_stack_fffffffffffffe6d,
                                                               CONCAT14(in_stack_fffffffffffffe6c,
                                                                        CONCAT13(
                                                  in_stack_fffffffffffffe6b,
                                                  CONCAT12(in_stack_fffffffffffffe6a,
                                                           CONCAT11(in_stack_fffffffffffffe69,
                                                                    in_stack_fffffffffffffe68)))))))
                     );
  *pvVar4 = 42.0;
  Imath_3_2::Vec4<float>::operator=<std::array<float,_4UL>,_0>
            (this,(array<float,_4UL> *)
                  CONCAT17(uVar11,CONCAT16(uVar10,CONCAT15(in_stack_fffffffffffffe6d,
                                                           CONCAT14(in_stack_fffffffffffffe6c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffe6b,
                                                  CONCAT12(in_stack_fffffffffffffe6a,
                                                           CONCAT11(in_stack_fffffffffffffe69,
                                                                    in_stack_fffffffffffffe68)))))))
            );
  pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_ec,0);
  uVar9 = false;
  if ((*pfVar2 == 1.0) && (!NAN(*pfVar2))) {
    pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_ec,1);
    uVar9 = false;
    if ((*pfVar2 == 42.0) && (!NAN(*pfVar2))) {
      pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_ec,2);
      uVar9 = false;
      if ((*pfVar2 == 3.0) && (!NAN(*pfVar2))) {
        pfVar2 = Imath_3_2::Vec4<float>::operator[](&local_ec,3);
        uVar9 = *pfVar2 == 4.0;
      }
    }
  }
  if ((bool)uVar9 == false) {
    __assert_fail("v[0] == 1 && v[1] == 42 && v[2] == 3 && v[3] == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x210,"void (anonymous namespace)::testInteropVec4()");
  }
  Imath_3_2::Vec4<float>::Vec4<std::array<float,_4UL>,_0>
            (v_00,(array<float,_4UL> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
            );
  testVecVal4f(v_00,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,(float)((ulong)this >> 0x20)
               ,SUB84(this,0));
  Imath_3_2::Vec4<float>::Vec4(local_10c,1.0,2.0,3.0,4.0);
  pfVar2 = Imath_3_2::Vec4<float>::operator[](local_10c,0);
  uVar8 = false;
  if ((*pfVar2 == 1.0) && (!NAN(*pfVar2))) {
    pfVar2 = Imath_3_2::Vec4<float>::operator[](local_10c,1);
    uVar8 = false;
    if ((*pfVar2 == 2.0) && (!NAN(*pfVar2))) {
      pfVar2 = Imath_3_2::Vec4<float>::operator[](local_10c,2);
      uVar8 = false;
      if ((*pfVar2 == 3.0) && (!NAN(*pfVar2))) {
        pfVar2 = Imath_3_2::Vec4<float>::operator[](local_10c,3);
        uVar8 = *pfVar2 == 4.0;
      }
    }
  }
  if ((bool)uVar8 == false) {
    __assert_fail("v[0] == 1 && v[1] == 2 && v[2] == 3 && v[3] == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x216,"void (anonymous namespace)::testInteropVec4()");
  }
  Imath_3_2::Vec4<float>::Vec4(&local_11c,1.0,42.0,3.0,4.0);
  Imath_3_2::Vec4<float>::operator=(local_10c,&local_11c);
  pfVar2 = Imath_3_2::Vec4<float>::operator[](local_10c,0);
  uVar7 = false;
  if ((*pfVar2 == 1.0) && (!NAN(*pfVar2))) {
    pfVar2 = Imath_3_2::Vec4<float>::operator[](local_10c,1);
    uVar7 = false;
    if ((*pfVar2 == 42.0) && (!NAN(*pfVar2))) {
      pfVar2 = Imath_3_2::Vec4<float>::operator[](local_10c,2);
      uVar7 = false;
      if ((*pfVar2 == 3.0) && (!NAN(*pfVar2))) {
        pfVar2 = Imath_3_2::Vec4<float>::operator[](local_10c,3);
        uVar7 = *pfVar2 == 4.0;
      }
    }
  }
  if ((bool)uVar7 == false) {
    __assert_fail("v[0] == 1 && v[1] == 42 && v[2] == 3 && v[3] == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x218,"void (anonymous namespace)::testInteropVec4()");
  }
  Imath_3_2::Vec4<float>::Vec4(&local_12c,1.0,42.0,3.0,4.0);
  testVecVal4f(v_00,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,(float)((ulong)this >> 0x20)
               ,SUB84(this,0));
  local_148[0] = 1.0;
  local_148[1] = 2.0;
  local_148[2] = 3.0;
  local_148[3] = 4.0;
  Imath_3_2::Vec4<float>::Vec4<float[4],_0>
            (this,(float (*) [4])
                  CONCAT17(uVar11,CONCAT16(uVar10,CONCAT15(uVar9,CONCAT14(uVar8,CONCAT13(uVar7,
                                                  CONCAT12(in_stack_fffffffffffffe6a,
                                                           CONCAT11(in_stack_fffffffffffffe69,
                                                                    in_stack_fffffffffffffe68)))))))
            );
  pfVar2 = Imath_3_2::Vec4<float>::operator[]((Vec4<float> *)&stack0xfffffffffffffea8,0);
  uVar6 = false;
  if ((*pfVar2 == 1.0) && (!NAN(*pfVar2))) {
    pfVar2 = Imath_3_2::Vec4<float>::operator[]((Vec4<float> *)&stack0xfffffffffffffea8,1);
    uVar6 = false;
    if ((*pfVar2 == 2.0) && (!NAN(*pfVar2))) {
      pfVar2 = Imath_3_2::Vec4<float>::operator[]((Vec4<float> *)&stack0xfffffffffffffea8,2);
      uVar6 = false;
      if ((*pfVar2 == 3.0) && (!NAN(*pfVar2))) {
        pfVar2 = Imath_3_2::Vec4<float>::operator[]((Vec4<float> *)&stack0xfffffffffffffea8,3);
        uVar6 = *pfVar2 == 4.0;
      }
    }
  }
  if ((bool)uVar6 == false) {
    __assert_fail("v[0] == 1 && v[1] == 2 && v[2] == 3 && v[3] == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x21f,"void (anonymous namespace)::testInteropVec4()");
  }
  local_148[1] = 42.0;
  Imath_3_2::Vec4<float>::operator=<float[4],_0>
            ((Vec4<float> *)&stack0xfffffffffffffea8,(float (*) [4])local_148);
  pfVar2 = Imath_3_2::Vec4<float>::operator[]((Vec4<float> *)&stack0xfffffffffffffea8,0);
  bVar5 = false;
  if ((*pfVar2 == 1.0) && (!NAN(*pfVar2))) {
    pfVar2 = Imath_3_2::Vec4<float>::operator[]((Vec4<float> *)&stack0xfffffffffffffea8,1);
    bVar5 = false;
    if ((*pfVar2 == 42.0) && (!NAN(*pfVar2))) {
      pfVar2 = Imath_3_2::Vec4<float>::operator[]((Vec4<float> *)&stack0xfffffffffffffea8,2);
      bVar5 = false;
      if ((*pfVar2 == 3.0) && (!NAN(*pfVar2))) {
        pfVar2 = Imath_3_2::Vec4<float>::operator[]((Vec4<float> *)&stack0xfffffffffffffea8,3);
        bVar5 = *pfVar2 == 4.0;
      }
    }
  }
  if (bVar5 == false) {
    __assert_fail("v[0] == 1 && v[1] == 42 && v[2] == 3 && v[3] == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x222,"void (anonymous namespace)::testInteropVec4()");
  }
  Imath_3_2::Vec4<float>::Vec4<float[4],_0>
            (this,(float (*) [4])
                  CONCAT17(uVar11,CONCAT16(uVar10,CONCAT15(uVar9,CONCAT14(uVar8,CONCAT13(uVar7,
                                                  CONCAT12(uVar6,CONCAT11(bVar5,
                                                  in_stack_fffffffffffffe68))))))));
  testVecVal4f(v_00,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,(float)((ulong)this >> 0x20)
               ,SUB84(this,0));
  return;
}

Assistant:

void
testInteropVec4 ()
{
    std::cout << "has_xyzw<SimpleVec<float,4>, float>::value = "
              << has_xyzw<SimpleVec<float, 4>, float>::value << "\n";
    std::cout << "has_xyzw<SimpleVec<int,4>, float>::value = "
              << has_xyzw<SimpleVec<int, 4>, float>::value << "\n";
    std::cout << "has_xyzw<SimpleVec<float,4>, float>::value = "
              << has_xyzw<SimpleVec<float, 4>, float>::value << "\n";
    std::cout << "has_xyzw<xyzw<float>, float>::value = "
              << has_xyzw<xyzw<float>, float>::value << "\n";
    std::cout << "has_xyzw<xyzw<float>, float>::value = "
              << has_xyzw<xyzw<float>, float>::value << "\n";
    std::cout << "has_xyzw<xy<float>, float>::value = "
              << has_xyzw<xy<float>, float>::value << "\n";
    std::cout << "has_xyzw<xyzw<int>, float>::value = "
              << has_xyzw<xyzw<int>, float>::value << "\n";
    std::cout << "has_xyzw<xyz_wrong<float>, float>::value = "
              << has_xyzw<xyz_wrong<float>, float>::value << "\n";
    std::cout << "\n";
    std::cout << "has_subscript<SimpleVec<float,4>, float, 4>::value = "
              << has_subscript<SimpleVec<float, 4>, float, 4>::value << "\n";
    std::cout << "has_subscript<SimpleVec<int,4>, float, 4>::value = "
              << has_subscript<SimpleVec<int, 4>, float, 4>::value << "\n";
    std::cout << "has_subscript<SimpleVec<float,4>, float, 4>::value = "
              << has_subscript<SimpleVec<float, 4>, float, 4>::value << "\n";
    std::cout << "has_subscript<xyzw<float>, float, 4>::value = "
              << has_subscript<xyzw<float>, float, 4>::value << "\n";
    std::cout << "has_subscript<xyzw<float>, float, 4>::value = "
              << has_subscript<xyzw<float>, float, 4>::value << "\n";
    std::cout << "has_subscript<xy<float>, float, 4>::value = "
              << has_subscript<xy<float>, float, 4>::value << "\n";
    std::cout << "has_subscript<xyzw<int>, float, 4>::value = "
              << has_subscript<xyzw<int>, float, 4>::value << "\n";
    std::cout << "has_subscript<xyz_wrong<float>, float, 4>::value = "
              << has_subscript<xyz_wrong<float>, float, 4>::value << "\n";
    std::cout << "has_subscript<std::array<float, 3>, float, 4>::value = "
              << has_subscript<std::array<float, 3>, float, 4>::value << "\n";
    std::cout << "has_subscript<std::array<int, 3>, float, 4>::value = "
              << has_subscript<std::array<int, 3>, float, 4>::value << "\n";
    std::cout << "has_subscript<std::array<float, 4>, float, 4>::value = "
              << has_subscript<std::array<float, 4>, float, 4>::value << "\n";
    std::cout << "has_subscript<std::vector<float>, float, 4>::value = "
              << has_subscript<std::vector<float>, float, 4>::value << "\n";
    std::cout << "\n";
    std::cout << "has_xyzw<ComboVec4<float>, float, 4>::value = "
              << has_xyzw<ComboVec4<float>, float>::value << "\n";
    std::cout << "has_subscript<ComboVec4<float>, float, 4>::value = "
              << has_subscript<ComboVec4<float>, float, 4>::value << "\n";
    std::cout << "\n";

    assert ((!has_xyzw<SimpleVec<float, 4>, float>::value));
    assert ((has_xyzw<xyzw<float>, float>::value));
    assert ((!has_xyzw<xyz<float>, float>::value));

    assert ((has_subscript<SimpleVec<float, 4>, float, 4>::value));
    assert ((!has_subscript<SimpleVec<float, 4>, float, 3>::value));
    assert ((!has_subscript<SimpleVec<float, 4>, int, 4>::value));
    assert ((!has_subscript<xyzw<float>, float, 4>::value));
    assert ((!has_subscript<xy<float>, float, 4>::value));

    // Test construction/assignment/paramater pass of a vector type with
    // subscripting to access components.
    {
        SimpleVec<float, 4> s;
        s[0] = 1;
        s[1] = 2;
        s[2] = 3;
        s[3] = 4;
        Vec4<float> v (s);
        assert (v[0] == 1 && v[1] == 2 && v[2] == 3 && v[3] == 4);
        s[1] = 42;
        v    = s;
        assert (v[0] == 1 && v[1] == 42 && v[2] == 3 && v[3] == 4);
        testVecVal4f (V4f (s), 1.0f, 42.0f, 3.0f, 4.0f);
    }
    // Test construction/assignment/paramater pass of a vector type with
    // explicit .y, .y, .z components but no subscripting.
    {
        xyzw<float> s{1, 2, 3, 4};
        Vec4<float> v (s);
        assert (v[0] == 1 && v[1] == 2 && v[2] == 3 && v[3] == 4);
        s.y = 42;
        v   = s;
        assert (v[0] == 1 && v[1] == 42 && v[2] == 3 && v[3] == 4);
        testVecVal4f (V4f (s), 1.0f, 42.0f, 3.0f, 4.0f);
    }
    // Test construction/assignment/paramater pass of a std::vector of length 3
    {
        std::vector<float> s{1, 2, 3, 4};
        Vec4<float>        v (s);
        assert (v[0] == 1 && v[1] == 2 && v[2] == 3 && v[3] == 4);
        s[1] = 42;
        v    = s;
        assert (v[0] == 1 && v[1] == 42 && v[2] == 3 && v[3] == 4);
        testVecVal4f (V4f (s), 1.0f, 42.0f, 3.0f, 4.0f);
    }
    // Test construction/assignment/paramater pass of a std::array of length 3
    {
        std::array<float, 4> s{1, 2, 3, 4};
        Vec4<float>          v (s);
        assert (v[0] == 1 && v[1] == 2 && v[2] == 3 && v[3] == 4);
        s[1] = 42;
        v    = s;
        assert (v[0] == 1 && v[1] == 42 && v[2] == 3 && v[3] == 4);
        testVecVal4f (V4f (s), 1.0f, 42.0f, 3.0f, 4.0f);
    }
    // Test construction/assignment/paramater pass of initializer lists.
    {
        Vec4<float> v ({1.0f, 2.0f, 3.0f, 4.0f});
        assert (v[0] == 1 && v[1] == 2 && v[2] == 3 && v[3] == 4);
        v = {1.0f, 42.0f, 3.0f, 4.0f};
        assert (v[0] == 1 && v[1] == 42 && v[2] == 3 && v[3] == 4);
        testVecVal4f ({1.0f, 42.0f, 3.0f, 4.0f}, 1, 42, 3, 4);
    }
    // Test construction/assignment/paramater pass of a C array
    {
        float       s[4] = {1, 2, 3, 4};
        Vec4<float> v (s);
        assert (v[0] == 1 && v[1] == 2 && v[2] == 3 && v[3] == 4);
        s[1] = 42;
        v    = s;
        assert (v[0] == 1 && v[1] == 42 && v[2] == 3 && v[3] == 4);
        testVecVal4f (V4f (s), 1.0f, 42.0f, 3.0f, 4.0f);
    }
}